

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

int Mpm_CutAlloc(Mpm_Man_t *p,int nLeaves,Mpm_Cut_t **ppCut)

{
  undefined1 *puVar1;
  Mpm_Cut_t *pMVar2;
  size_t __size;
  undefined4 uVar3;
  Mmr_Step_t *pMVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  void *__s;
  void *pvVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  
  pMVar4 = p->pManCuts;
  uVar12 = nLeaves * 4 + 0xcU >> 3;
  if (pMVar4->uMask < (int)uVar12) {
    __assert_fail("nWords > 0 && nWords <= p->uMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                  ,0xf3,"int Mmr_StepFetch(Mmr_Step_t *, int)");
  }
  iVar6 = pMVar4->nEntries + 1;
  pMVar4->nEntries = iVar6;
  pMVar4->nEntriesAll = pMVar4->nEntriesAll + 1;
  if (iVar6 < pMVar4->nEntriesMax) {
    iVar6 = pMVar4->nEntriesMax;
  }
  pMVar4->nEntriesMax = iVar6;
  lVar8 = (ulong)uVar12 * 0x38;
  if (*(int *)((long)pMVar4 + lVar8 + 0x44) != 0) goto LAB_0047e4ba;
  uVar7 = *(uint *)((long)pMVar4 + lVar8 + 0x34);
  bVar10 = *(byte *)((long)pMVar4 + lVar8 + 0x18);
  __size = (long)*(int *)((long)pMVar4 + lVar8 + 0x1c) * 8 + 8;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  uVar15 = *(uint *)((long)pMVar4 + lVar8 + 0x30);
  if (uVar7 == uVar15) {
    if ((int)uVar15 < 0x10) {
      pvVar9 = *(void **)((long)pMVar4 + lVar8 + 0x38);
      if (pvVar9 == (void *)0x0) {
        pvVar9 = malloc(0x80);
      }
      else {
        pvVar9 = realloc(pvVar9,0x80);
      }
      *(void **)((long)pMVar4 + lVar8 + 0x38) = pvVar9;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar15 * 2;
      if (iVar6 <= (int)uVar15) goto LAB_0047e40a;
      pvVar9 = *(void **)((long)pMVar4 + lVar8 + 0x38);
      if (pvVar9 == (void *)0x0) {
        pvVar9 = malloc((ulong)uVar15 << 4);
      }
      else {
        pvVar9 = realloc(pvVar9,(ulong)uVar15 << 4);
      }
      *(void **)((long)pMVar4 + lVar8 + 0x38) = pvVar9;
    }
    *(int *)((long)pMVar4 + lVar8 + 0x30) = iVar6;
  }
LAB_0047e40a:
  iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x34);
  *(int *)((long)pMVar4 + lVar8 + 0x34) = iVar6 + 1;
  *(void **)(*(long *)((long)pMVar4 + lVar8 + 0x38) + (long)iVar6 * 8) = __s;
  if (*(int *)((long)pMVar4 + lVar8 + 0x20) < *(int *)((long)pMVar4 + lVar8 + 0x1c)) {
    uVar15 = 1;
    do {
      Vec_IntPush((Vec_Int_t *)((long)pMVar4 + lVar8 + 0x40),uVar15 | uVar7 << (bVar10 & 0x1f));
      iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x20);
      uVar15 = uVar15 + iVar6;
    } while ((int)(iVar6 + uVar15) <= *(int *)((long)pMVar4 + lVar8 + 0x1c));
  }
  iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x44);
  if (1 < iVar6) {
    lVar5 = *(long *)((long)pMVar4 + lVar8 + 0x48);
    iVar11 = -1;
    lVar14 = 0;
    do {
      uVar3 = *(undefined4 *)(lVar5 + lVar14 * 4);
      *(undefined4 *)(lVar5 + lVar14 * 4) = *(undefined4 *)(lVar5 + (long)(iVar6 + iVar11) * 4);
      *(undefined4 *)(lVar5 + (long)(*(int *)((long)pMVar4 + lVar8 + 0x44) + iVar11) * 4) = uVar3;
      lVar14 = lVar14 + 1;
      iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x44);
      iVar11 = iVar11 + -1;
    } while (lVar14 < iVar6 / 2);
  }
LAB_0047e4ba:
  iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x28);
  iVar11 = *(int *)((long)pMVar4 + lVar8 + 0x24) + 1;
  *(int *)((long)pMVar4 + lVar8 + 0x24) = iVar11;
  if (iVar11 < iVar6) {
    iVar11 = iVar6;
  }
  *(int *)((long)pMVar4 + lVar8 + 0x28) = iVar11;
  iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x44);
  if (0 < iVar6) {
    uVar7 = iVar6 - 1;
    *(uint *)((long)pMVar4 + lVar8 + 0x44) = uVar7;
    uVar12 = *(int *)(*(long *)((long)pMVar4 + lVar8 + 0x48) + (ulong)uVar7 * 4) <<
             ((byte)pMVar4->nBits & 0x1f) | uVar12;
    pMVar4 = p->pManCuts;
    uVar7 = pMVar4->uMask & uVar12;
    if ((int)uVar7 < 1) {
      __assert_fail("(h & p->uMask) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                    ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
    }
    uVar15 = (int)uVar12 >> ((byte)pMVar4->nBits & 0x1f);
    if (0 < (int)uVar15) {
      iVar6 = *(int *)((long)pMVar4 + (ulong)uVar7 * 0x38 + 0x34);
      bVar10 = (byte)*(undefined4 *)((long)pMVar4 + (ulong)uVar7 * 0x38 + 0x18);
      if ((int)uVar15 < iVar6 << (bVar10 & 0x1f)) {
        bVar10 = bVar10 & 0x1f;
        uVar13 = uVar15 >> bVar10;
        if ((-1 < (int)(uVar15 >> bVar10)) && ((int)uVar13 < iVar6)) {
          pMVar2 = (Mpm_Cut_t *)
                   (*(long *)(*(long *)((long)pMVar4 + (ulong)uVar7 * 0x38 + 0x38) +
                             (ulong)uVar13 * 8) +
                   (ulong)(uVar15 & *(uint *)((long)pMVar4 + (ulong)uVar7 * 0x38 + 0x1c)) * 8);
          *ppCut = pMVar2;
          *(uint *)&pMVar2->field_0x4 = *(uint *)&pMVar2->field_0x4 & 0x7ffffff | nLeaves << 0x1b;
          pMVar2 = *ppCut;
          pMVar2->hNext = 0;
          puVar1 = &pMVar2->field_0x7;
          *puVar1 = *puVar1 & 0xfb;
          *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff;
          return uVar12;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
    __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                  ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//#define MIG_RUNTIME

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cut manipulation.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Mpm_CutAlloc( Mpm_Man_t * p, int nLeaves, Mpm_Cut_t ** ppCut )  
{ 
    int hHandle = Mmr_StepFetch( p->pManCuts, Mpm_CutWordNum(nLeaves) );
    *ppCut      = (Mpm_Cut_t *)Mmr_StepEntry( p->pManCuts, hHandle );
    (*ppCut)->nLeaves  = nLeaves;
    (*ppCut)->hNext    = 0;
    (*ppCut)->fUseless = 0;
    (*ppCut)->fCompl   = 0;
    return hHandle;
}